

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

uint do_with_oh<unsigned_int>
               (qpdf_data qpdf,qpdf_oh oh,function<unsigned_int_()> *fallback,
               function<unsigned_int_(QPDFObjectHandle_&)> *fn)

{
  uint uVar1;
  _Any_data local_80;
  code *local_70;
  undefined8 uStack_68;
  qpdf_oh local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  _Manager_type local_28;
  
  std::function<unsigned_int_()>::function((function<unsigned_int_()> *)&local_38,fallback);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::function
            ((function<unsigned_int_(QPDFObjectHandle_&)> *)&local_80,fn);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_60 = oh;
  local_58._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_68;
  if (local_70 != (code *)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_80._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_80._8_8_;
    *(code **)((long)local_58._M_unused._0_8_ + 0x10) = local_70;
    local_70 = (code *)0x0;
    uStack_68 = 0;
  }
  *(qpdf_oh *)((long)local_58._M_unused._0_8_ + 0x20) = oh;
  pcStack_40 = std::
               _Function_handler<unsigned_int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<unsigned_int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  uVar1 = trap_oh_errors<unsigned_int>
                    (qpdf,(function<unsigned_int_()> *)&local_38,
                     (function<unsigned_int_(_qpdf_data_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return uVar1;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}